

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
 Lib::
 VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
 ::getEmpty(void)

{
  int iVar1;
  IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
  *core;
  IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
  *in_RDI;
  
  if (VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
      ::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
                                 ::getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
              *)EmptyIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
                ::operator_new(0x7aa43a);
      EmptyIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
      ::EmptyIterator((EmptyIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
                       *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
                           ::getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
                   *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
          )in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }